

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O3

bool __thiscall QProcessPrivate::_q_startupNotification(QProcessPrivate *this)

{
  QObject *sender;
  bool bVar1;
  EVP_PKEY_CTX *ctx;
  long in_FS_OFFSET;
  QString local_58;
  undefined1 local_39;
  void *local_38;
  undefined1 *local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  sender = (this->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  bVar1 = processStarted(this,&local_58);
  if (bVar1) {
    QProcess::setProcessState((QProcess *)sender,Running);
    local_38 = (void *)0x0;
    local_30 = &local_39;
    QMetaObject::activate(sender,&QProcess::staticMetaObject,0,&local_38);
  }
  else {
    QProcess::setProcessState((QProcess *)sender,NotRunning);
    ctx = (EVP_PKEY_CTX *)0x0;
    setErrorAndEmit(this,FailedToStart,&local_58);
    waitForDeadChild(this);
    cleanup(this,ctx);
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QProcessPrivate::_q_startupNotification()
{
    Q_Q(QProcess);
#if defined QPROCESS_DEBUG
    qDebug("QProcessPrivate::startupNotification()");
#endif

    QString errorMessage;
    if (processStarted(&errorMessage)) {
        q->setProcessState(QProcess::Running);
        emit q->started(QProcess::QPrivateSignal());
        return true;
    }

    q->setProcessState(QProcess::NotRunning);
    setErrorAndEmit(QProcess::FailedToStart, errorMessage);
#ifdef Q_OS_UNIX
    waitForDeadChild();
#endif
    cleanup();
    return false;
}